

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Graph * __thiscall
soul::PoolAllocator::
allocate<soul::AST::Graph,soul::CodeLocation&,soul::AST::Context&,soul::Identifier&>
          (PoolAllocator *this,CodeLocation *args,Context *args_1,Identifier *args_2)

{
  Context *this_00;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_5d [13];
  string *local_50;
  CodeLocation local_48;
  Graph *local_38;
  Graph *newObject;
  PoolItem *newItem;
  Identifier *args_local_2;
  Context *args_local_1;
  CodeLocation *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (Identifier *)args_1;
  args_local_1 = (Context *)args;
  args_local = (CodeLocation *)this;
  newObject = (Graph *)allocateSpaceForObject(this,400);
  this_00 = &(newObject->super_ProcessorBase).super_ModuleBase.super_ASTObject.context;
  CodeLocation::CodeLocation(&local_48,&args_local_1->location);
  local_50 = (string *)newItem->size;
  AST::Graph::Graph((Graph *)this_00,&local_48,(Context *)args_local_2,(Identifier)local_50);
  CodeLocation::~CodeLocation(&local_48);
  local_38 = (Graph *)this_00;
  pDVar1 = allocate(soul::CodeLocation&,soul::AST::Context&,soul::Identifier&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(local_5d);
  *(DestructorFn **)&(newObject->super_ProcessorBase).super_ModuleBase.super_ASTObject.objectType =
       pDVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }